

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O2

void __thiscall
acto::actor::set_handler
          (actor *this,type_index *type,
          unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_> *h)

{
  __uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_> *this_00;
  size_t __code;
  __node_base_ptr __prev_n;
  ulong __bkt;
  handlers *this_01;
  
  this_01 = &this->handlers_;
  if ((h->_M_t).
      super___uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>.
      _M_t.
      super__Tuple_impl<0UL,_acto::actor::handler_t_*,_std::default_delete<acto::actor::handler_t>_>
      .super__Head_base<0UL,_acto::actor::handler_t_*,_false>._M_head_impl != (handler_t *)0x0) {
    this_00 = (__uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>
               *)std::__detail::
                 _Map_base<std::type_index,_std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_01,type);
    std::__uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>::
    operator=(this_00,(__uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>
                       *)h);
    return;
  }
  __code = std::type_index::hash_code(type);
  __bkt = __code % (this->handlers_)._M_h._M_bucket_count;
  __prev_n = std::
             _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node(&this_01->_M_h,__bkt,type,__code);
  if (__prev_n != (__node_base_ptr)0x0) {
    std::
    _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&this_01->_M_h,__bkt,__prev_n,(__node_ptr)__prev_n->_M_nxt);
  }
  return;
}

Assistant:

void actor::set_handler(const std::type_index& type,
                        std::unique_ptr<handler_t> h) {
  if (h) {
    handlers_[type] = std::move(h);
  } else {
    handlers_.erase(type);
  }
}